

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztrigraphd.cpp
# Opt level: O0

int64_t __thiscall TPZGraphElTd::EqNum(TPZGraphElTd *this,TPZVec<int> *co)

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  TPZVec<int> *in_RSI;
  long in_RDI;
  int run;
  int neq;
  int imax;
  int res;
  undefined4 local_20;
  undefined4 local_1c;
  
  iVar1 = TPZGraphMesh::Res(*(TPZGraphMesh **)(in_RDI + 0x10));
  iVar2 = TPZGraphNode::FirstPoint(*(TPZGraphNode **)(in_RDI + 0x20));
  piVar3 = TPZVec<int>::operator[](in_RSI,1);
  local_1c = (int)iVar2 + *piVar3;
  local_20 = 0;
  while( true ) {
    piVar3 = TPZVec<int>::operator[](in_RSI,0);
    if (*piVar3 <= local_20) break;
    local_1c = (((1 << ((byte)iVar1 & 0x1f)) + 1) - local_20) + local_1c;
    local_20 = local_20 + 1;
  }
  return (long)local_1c;
}

Assistant:

int64_t TPZGraphElTd::EqNum(TPZVec<int> &co){
	int res = fGraphMesh->Res();
	int imax = (1<<res)+1;
	int neq = fConnect->FirstPoint() + co[1];
	for(int run=0;run<co[0];run++) neq += imax-run;
	return neq;
}